

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::insert_node_after(xml_node_struct *child,xml_node_struct *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *next;
  xml_node_struct *parent;
  xml_node_struct *node_local;
  xml_node_struct *child_local;
  
  pxVar1 = node->parent;
  child->parent = pxVar1;
  pxVar2 = node->next_sibling;
  if (pxVar2 == (xml_node_struct *)0x0) {
    pxVar1->first_child->prev_sibling_c = child;
  }
  else {
    pxVar2->prev_sibling_c = child;
  }
  child->next_sibling = pxVar2;
  child->prev_sibling_c = node;
  node->next_sibling = child;
  return;
}

Assistant:

inline void insert_node_after(xml_node_struct* child, xml_node_struct* node)
	{
		xml_node_struct* parent = node->parent;

		child->parent = parent;

		xml_node_struct* next = node->next_sibling;

		if (next)
			next->prev_sibling_c = child;
		else
			parent->first_child->prev_sibling_c = child;

		child->next_sibling = next;
		child->prev_sibling_c = node;

		node->next_sibling = child;
	}